

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  long lVar1;
  char *message;
  Generator<std::pair<const_int,_int>,_void> gen;
  TypeParam n;
  TypeParam m;
  Generator<std::pair<const_int,_int>,_void> local_939;
  AssertHelper local_938;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_930;
  pair<const_int,_int> local_928;
  pair<const_int,_int> local_920;
  allocator_type local_918;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_910;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_490;
  
  local_910.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_939);
  local_910.sets_._M_elems[0].set_.slots_ =
       (slot_type *)
       hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_939);
  local_910.sets_._M_elems[0].set_.size_ =
       (size_t)hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_939);
  local_928 = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_930._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_938.data_ = (AssertHelperData *)0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (pair<const_int,_int>)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
              next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::parallel_hash_set<std::pair<int_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_490,(pair<const_int,_int> *)&local_910,
             (pair<const_int,_int> *)&local_910.sets_._M_elems[0].set_.capacity_,0,
             (hasher *)&local_928,(key_equal *)&local_930,(allocator_type *)&local_938);
  local_928 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_939);
  local_930._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_938.data_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_918.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (pair<const_int,_int>)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId->type + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::parallel_hash_set<std::pair<int_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_910,&local_928,&local_920,0,(hasher *)&local_930,(key_equal *)&local_938,
             &local_918);
  lVar1 = 0;
  do {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::operator=((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *)((long)&local_910.sets_._M_elems[0].set_.ctrl_ + lVar1),
                (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar1));
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x480);
  testing::internal::
  CmpHelperEQ<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>,phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
            ((internal *)&local_928,"m","n",
             (parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)&local_490,
             (parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)&local_910);
  if ((char)local_928.first == '\0') {
    testing::Message::Message((Message *)&local_930);
    if (local_920 == (pair<const_int,_int>)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_920;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(&local_938,(Message *)&local_930);
    testing::internal::AssertHelper::~AssertHelper(&local_938);
    if (local_930._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_930._M_head_impl + 8))();
    }
  }
  if (local_920 != (pair<const_int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_920,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_910);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam n({gen()});
  n = m;
  EXPECT_EQ(m, n);
}